

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void handle_base_flags(int flag_char,char *flag_arg,print_usage_f *print_usage,char *appl,
                      char **default_outfilep)

{
  char **default_outfilep_local;
  char *appl_local;
  print_usage_f *print_usage_local;
  char *flag_arg_local;
  int flag_char_local;
  
  if (flag_char == 0x6f) {
    *default_outfilep = flag_arg;
  }
  else {
    if (flag_char != 0x71) {
      if (flag_char == 0x76) {
        print_license();
        exit(0);
      }
      if (flagflag != 0x3f) {
        if (~LOG_DEBUG < G_log_level) {
          G_log_log_level = LOG_ERROR;
          log_log_default("error, invalid option \"-%c\"",(ulong)(uint)flagflag);
        }
        if ((flagarg != (char *)0x0) && (~LOG_DEBUG < G_log_level)) {
          G_log_log_level = LOG_ERROR;
          log_log_default(" with argument \"%s\"",flagarg);
        }
        if (~LOG_DEBUG < G_log_level) {
          G_log_log_level = LOG_ERROR;
          log_log_default("\n");
        }
      }
      (*print_usage)(appl,LOG_BRIEF,*default_outfilep);
      exit(0);
    }
    log_set_level(G_log_ctx,LOG_BRIEF);
    G_log_level = LOG_BRIEF;
  }
  return;
}

Assistant:

void handle_base_flags(int flag_char, /* IN */
                       const char *flag_arg, /* IN */
                       print_usage_f *print_usage, /* IN */
                       const char *appl, /* IN */
                       const char **default_outfilep) /* IN */
{
    switch(flag_char)
    {
    case 'o':
        *default_outfilep = flag_arg;
        break;
    case 'q':
        LOG_SET_LEVEL(LOG_BRIEF);
        break;
    case 'v':
        print_license();
        exit(0);
    default:
        if (flagflag != '?')
        {
            LOG(LOG_ERROR,
                ("error, invalid option \"-%c\"", flagflag));
            if (flagarg != NULL)
            {
                LOG(LOG_ERROR, (" with argument \"%s\"", flagarg));
            }
            LOG(LOG_ERROR, ("\n"));
        }
        print_usage(appl, LOG_BRIEF, *default_outfilep);
        exit(0);
    }
}